

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 rhs;
  mt19937_64 *__urng;
  long lVar3;
  pointer *__ptr;
  char *pcVar4;
  _Head_base<0UL,_const_int_&,_false> *p_Var5;
  T val2;
  AssertionResult gtest_ar_;
  T val;
  AssertionResult gtest_ar;
  TypeParam m;
  AssertHelper local_780;
  AssertHelper local_778;
  _Head_base<0UL,_const_int_&,_false> local_770;
  _Head_base<0UL,_const_int_&,_false> local_768;
  pair<const_int,_int> local_760;
  undefined1 local_758 [8];
  Inner *local_750;
  __native_type local_748;
  AssertHelper local_720;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_718;
  
  local_760 = hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()
                        ((Generator<std::pair<const_int,_int>,_void> *)&local_718);
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)&local_750 + lVar3) = 0;
    *(undefined8 *)((long)&local_748 + lVar3) = 0;
    *(undefined8 *)((long)&local_760.first + lVar3) = 0;
    *(undefined8 *)(local_758 + lVar3) = 0;
    *(undefined8 *)((long)&local_770._M_head_impl + lVar3) = 0;
    *(undefined8 *)((long)&local_768._M_head_impl + lVar3) = 0;
    *(undefined8 *)((long)&local_780.data_ + lVar3) = 0;
    *(undefined8 *)((long)&local_778.data_ + lVar3) = 0;
    *(undefined8 *)((long)&local_748 + lVar3 + 8) = 0;
    *(undefined8 *)((long)&local_748 + lVar3 + 0x18) = 0;
    *(long *)((long)&local_748 + lVar3 + 0x20) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&local_720.data_ + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_718.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  local_768._M_head_impl = &local_760.second;
  local_770._M_head_impl = &local_760.first;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_760.first;
  p_Var5 = &local_770;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_758,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_718,local_770._M_head_impl,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)p_Var5,
             (tuple<const_int_&> *)&local_768);
  rhs = local_748._8_8_;
  local_770._M_head_impl._0_1_ = local_758 != (undefined1  [8])0x0;
  local_768._M_head_impl = (int *)0x0;
  if (local_758 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_778);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_758,(internal *)&local_770,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_758);
    testing::internal::AssertHelper::operator=(&local_780,(Message *)&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_780);
    if (local_758 != (undefined1  [8])&local_748) {
      operator_delete((void *)local_758,(ulong)(local_748.__align + 1));
    }
    if ((long *)CONCAT44(local_778.data_._4_4_,(int)local_778.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_778.data_._4_4_,(int)local_778.data_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_768,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_768._M_head_impl);
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_758,"val","*it",&local_760,(pair<const_int,_int> *)rhs);
  if (local_758[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_770);
    if (local_750 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_750->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=(&local_778,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    if ((long *)local_770._M_head_impl != (long *)0x0) {
      (**(code **)(*(long *)local_770._M_head_impl + 8))();
    }
  }
  if (local_750 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750);
  }
  local_758 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_778.data_._4_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)local_758,__urng,(param_type *)local_758);
  local_768._M_head_impl = (int *)((long)&local_778.data_ + 4);
  local_778.data_._0_4_ = local_760.first;
  local_770._M_head_impl = (int *)&local_778;
  p_Var5 = &local_770;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_760.first;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_758,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_718,local_770._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)p_Var5,
             (tuple<const_int_&> *)&local_768);
  local_770._M_head_impl._0_1_ = local_758 != (undefined1  [8])0x0;
  local_768._M_head_impl = (int *)0x0;
  if (local_758 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_758,(internal *)&local_770,(AssertionResult *)"it != m.end()","false"
               ,"true",(char *)p_Var5);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_758);
    testing::internal::AssertHelper::operator=(&local_720,(Message *)&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    if (local_758 != (undefined1  [8])&local_748) {
      operator_delete((void *)local_758,(ulong)(local_748.__align + 1));
    }
    if (local_780.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_780.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_768,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_768._M_head_impl);
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_758,"val","*it",&local_760,(pair<const_int,_int> *)local_748._8_8_);
  if (local_758[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_770);
    if (local_750 == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_750->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_780,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_780);
    if ((long *)local_770._M_head_impl != (long *)0x0) {
      (**(code **)(*(long *)local_770._M_head_impl + 8))();
    }
  }
  if (local_750 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_718);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}